

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmakeevaluator.cpp
# Opt level: O3

ProString * __thiscall
QMakeEvaluator::propertyValue(ProString *__return_storage_ptr__,QMakeEvaluator *this,ProKey *name)

{
  bool bVar1;
  char16_t *pcVar2;
  long in_FS_OFFSET;
  QLatin1String other;
  QString local_38;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  other.m_data = "QMAKE_MKSPECS";
  other.m_size = 0xd;
  bVar1 = ProString::operator==(&name->super_ProString,other);
  if (bVar1) {
    pcVar2 = (this->m_option->dirlist_sep).d.ptr;
    if (pcVar2 == (char16_t *)0x0) {
      pcVar2 = (char16_t *)&QString::_empty;
    }
    QtPrivate::QStringList_join((QList *)&local_38,(QChar *)&this->m_mkspecPaths,(longlong)pcVar2);
    ProString::ProString(__return_storage_ptr__,&local_38);
    if (&(local_38.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_38.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_38.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_38.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_38.d.d)->super_QArrayData,2,0x10);
      }
    }
    if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
      return __return_storage_ptr__;
    }
  }
  else {
    *(undefined1 **)&__return_storage_ptr__->m_file = &DAT_aaaaaaaaaaaaaaaa;
    __return_storage_ptr__->m_hash = (size_t)&DAT_aaaaaaaaaaaaaaaa;
    (__return_storage_ptr__->m_string).d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
    *(undefined1 **)&__return_storage_ptr__->m_offset = &DAT_aaaaaaaaaaaaaaaa;
    (__return_storage_ptr__->m_string).d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
    (__return_storage_ptr__->m_string).d.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
    if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
      QMakeProperty::value(__return_storage_ptr__,this->m_option->property,name);
      return __return_storage_ptr__;
    }
  }
  __stack_chk_fail();
}

Assistant:

ProString QMakeEvaluator::propertyValue(const ProKey &name) const
{
    if (name == QLatin1String("QMAKE_MKSPECS"))
        return ProString(m_mkspecPaths.join(m_option->dirlist_sep));
    ProString ret = m_option->propertyValue(name);
//    if (ret.isNull())
//        evalError(fL1S("Querying unknown property %1").arg(name.toQStringView()));
    return ret;
}